

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

char * nullcGetArgumentVector(uint functionID,uintptr_t extra,__va_list_tag *args)

{
  uint uVar1;
  uintptr_t uVar2;
  int iVar3;
  float *pfVar4;
  uintptr_t *puVar5;
  double *pdVar6;
  uint *puVar7;
  float *pfVar8;
  uint uVar9;
  char *__function;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  
  if (*(uint *)(NULLC::linker + 0x24c) <= functionID) {
    __function = 
    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
LAB_0021bd44:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,__function);
  }
  bVar15 = *(int *)(*(long *)(NULLC::linker + 0x240) + 0x54 + (ulong)functionID * 0x94) != 0;
  pfVar8 = NULLC::argBuf;
  if (bVar15) {
    lVar12 = *(long *)(NULLC::linker + 0x240) + (ulong)functionID * 0x94;
    uVar13 = 0;
    do {
      uVar9 = *(int *)(lVar12 + 0x50) + uVar13;
      if (*(uint *)(NULLC::linker + 0x27c) <= uVar9) {
        __function = 
        "T &FastVector<ExternLocalInfo>::operator[](unsigned int) [T = ExternLocalInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_0021bd44;
      }
      uVar9 = *(uint *)(*(long *)(NULLC::linker + 0x270) + 4 + (ulong)uVar9 * 0x1c);
      if (*(uint *)(NULLC::linker + 0x20c) <= uVar9) {
LAB_0021bd18:
        __function = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_0021bd44;
      }
      lVar11 = *(long *)(NULLC::linker + 0x200);
      lVar10 = (ulong)uVar9 * 0x50;
      switch(*(undefined4 *)(lVar11 + 0xc + lVar10)) {
      case 0:
        if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoRefHash == '\0')
           && (iVar3 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                            ::autoRefHash), iVar3 != 0)) {
          nullcGetArgumentVector::autoRefHash = NULLC::GetStringHash("auto ref");
          __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                               autoRefHash);
        }
        if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoArrayHash ==
             '\0') &&
           (iVar3 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                         ::autoArrayHash), iVar3 != 0)) {
          nullcGetArgumentVector::autoArrayHash = NULLC::GetStringHash("auto[]");
          __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                               autoArrayHash);
        }
        lVar11 = lVar11 + lVar10;
        iVar3 = *(int *)(lVar11 + 0x10);
        if ((iVar3 == 3) || (*(int *)(lVar11 + 0x18) == -1 && iVar3 == 1)) {
          uVar9 = args->gp_offset;
          if ((ulong)uVar9 < 0x21) {
            puVar5 = (uintptr_t *)((ulong)uVar9 + (long)args->reg_save_area);
            args->gp_offset = uVar9 + 0x10;
          }
          else {
            puVar5 = (uintptr_t *)args->overflow_arg_area;
            args->overflow_arg_area = puVar5 + 2;
          }
          bVar16 = true;
          uVar2 = *puVar5;
          pfVar8[2] = *(float *)(puVar5 + 1);
          *(uintptr_t *)pfVar8 = uVar2;
          pfVar8 = pfVar8 + 3;
        }
        else {
          if (*(uint *)(lVar11 + 0x28) == nullcGetArgumentVector::autoRefHash) {
            puVar5 = (uintptr_t *)args->overflow_arg_area;
            args->overflow_arg_area = puVar5 + 2;
            uVar2 = *puVar5;
            pfVar8[2] = *(float *)(puVar5 + 1);
            *(uintptr_t *)pfVar8 = uVar2;
            pfVar8 = pfVar8 + 3;
            goto switchD_0021b8d9_caseD_1;
          }
          bVar16 = true;
          if (*(uint *)(lVar11 + 0x28) == nullcGetArgumentVector::autoArrayHash) {
            puVar5 = (uintptr_t *)args->overflow_arg_area;
            args->overflow_arg_area = puVar5 + 2;
            uVar2 = puVar5[1];
            *(uintptr_t *)pfVar8 = *puVar5;
            *(uintptr_t *)(pfVar8 + 2) = uVar2;
            pfVar8 = pfVar8 + 4;
          }
          else if (iVar3 == 4) {
            if (*(uint *)(NULLC::linker + 0x21c) <= *(uint *)(lVar11 + 0x24)) {
              __function = 
              "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
              ;
              goto LAB_0021bd44;
            }
            bVar16 = *(int *)(lVar11 + 0x18) == 0;
            if (!bVar16) {
              puVar7 = (uint *)((ulong)*(uint *)(lVar11 + 0x24) * 0xc +
                               *(long *)(NULLC::linker + 0x210));
              uVar9 = 0;
              do {
                if (*(uint *)(NULLC::linker + 0x20c) <= *puVar7) goto LAB_0021bd18;
                switch(*(undefined4 *)
                        (*(long *)(NULLC::linker + 0x200) + 0xc + (ulong)*puVar7 * 0x50)) {
                case 2:
                case 6:
                case 7:
                  uVar1 = args->gp_offset;
                  if ((ulong)uVar1 < 0x29) {
                    pfVar4 = (float *)((ulong)uVar1 + (long)args->reg_save_area);
                    args->gp_offset = uVar1 + 8;
                  }
                  else {
                    pfVar4 = (float *)args->overflow_arg_area;
                    args->overflow_arg_area = pfVar4 + 2;
                  }
                  *pfVar8 = *pfVar4;
                  break;
                case 3:
                  uVar1 = args->fp_offset;
                  if ((ulong)uVar1 < 0xa1) {
                    pdVar6 = (double *)((ulong)uVar1 + (long)args->reg_save_area);
                    args->fp_offset = uVar1 + 0x10;
                  }
                  else {
                    pdVar6 = (double *)args->overflow_arg_area;
                    args->overflow_arg_area = pdVar6 + 1;
                  }
                  *pfVar8 = (float)*pdVar6;
                  break;
                case 4:
                  uVar1 = args->gp_offset;
                  if ((ulong)uVar1 < 0x29) {
                    puVar5 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
                    args->gp_offset = uVar1 + 8;
                  }
                  else {
                    puVar5 = (uintptr_t *)args->overflow_arg_area;
                    args->overflow_arg_area = puVar5 + 1;
                  }
                  *(uintptr_t *)pfVar8 = *puVar5;
                  goto LAB_0021bc42;
                case 5:
                  uVar1 = args->fp_offset;
                  if ((ulong)uVar1 < 0xa1) {
                    puVar5 = (uintptr_t *)((ulong)uVar1 + (long)args->reg_save_area);
                    args->fp_offset = uVar1 + 0x10;
                  }
                  else {
                    puVar5 = (uintptr_t *)args->overflow_arg_area;
                    args->overflow_arg_area = puVar5 + 1;
                  }
                  *(uintptr_t *)pfVar8 = *puVar5;
LAB_0021bc42:
                  pfVar8 = pfVar8 + 2;
                  goto LAB_0021bc46;
                default:
                  NULLC::nullcLastError = "ERROR: unsupported complex function parameter";
                  bVar14 = false;
                  goto LAB_0021bc48;
                }
                pfVar8 = pfVar8 + 1;
LAB_0021bc46:
                bVar14 = true;
LAB_0021bc48:
                if (!bVar14) break;
                uVar9 = uVar9 + 1;
                puVar7 = puVar7 + 3;
                bVar14 = uVar9 < *(uint *)(lVar11 + 0x18);
                bVar16 = !bVar14;
              } while (bVar14);
            }
          }
          else {
            NULLC::nullcLastError = "ERROR: unsupported complex function parameter";
            bVar16 = false;
          }
        }
        break;
      default:
switchD_0021b8d9_caseD_1:
        bVar16 = true;
        break;
      case 2:
      case 6:
      case 7:
        uVar9 = args->gp_offset;
        if ((ulong)uVar9 < 0x29) {
          pfVar4 = (float *)((ulong)uVar9 + (long)args->reg_save_area);
          args->gp_offset = uVar9 + 8;
        }
        else {
          pfVar4 = (float *)args->overflow_arg_area;
          args->overflow_arg_area = pfVar4 + 2;
        }
        *pfVar8 = *pfVar4;
        goto LAB_0021ba60;
      case 3:
        uVar9 = args->fp_offset;
        if ((ulong)uVar9 < 0xa1) {
          pdVar6 = (double *)((ulong)uVar9 + (long)args->reg_save_area);
          args->fp_offset = uVar9 + 0x10;
        }
        else {
          pdVar6 = (double *)args->overflow_arg_area;
          args->overflow_arg_area = pdVar6 + 1;
        }
        *pfVar8 = (float)*pdVar6;
LAB_0021ba60:
        bVar16 = true;
        pfVar8 = pfVar8 + 1;
        break;
      case 4:
        uVar9 = args->gp_offset;
        if ((ulong)uVar9 < 0x29) {
          puVar5 = (uintptr_t *)((ulong)uVar9 + (long)args->reg_save_area);
          args->gp_offset = uVar9 + 8;
        }
        else {
          puVar5 = (uintptr_t *)args->overflow_arg_area;
          args->overflow_arg_area = puVar5 + 1;
        }
        *(uintptr_t *)pfVar8 = *puVar5;
        goto LAB_0021ba3c;
      case 5:
        uVar9 = args->fp_offset;
        if ((ulong)uVar9 < 0xa1) {
          puVar5 = (uintptr_t *)((ulong)uVar9 + (long)args->reg_save_area);
          args->fp_offset = uVar9 + 0x10;
        }
        else {
          puVar5 = (uintptr_t *)args->overflow_arg_area;
          args->overflow_arg_area = puVar5 + 1;
        }
        *(uintptr_t *)pfVar8 = *puVar5;
LAB_0021ba3c:
        bVar16 = true;
        pfVar8 = pfVar8 + 2;
      }
      if (!bVar16) break;
      uVar13 = uVar13 + 1;
      bVar15 = uVar13 < *(uint *)(lVar12 + 0x54);
    } while (bVar15);
  }
  if (bVar15) {
    pfVar8 = (float *)0x0;
  }
  else {
    *(uintptr_t *)pfVar8 = extra;
    pfVar8 = NULLC::argBuf;
  }
  return (char *)pfVar8;
}

Assistant:

const char*	nullcGetArgumentVector(unsigned functionID, uintptr_t extra, va_list args)
{
	using namespace NULLC;

	// Copy arguments in argument buffer
	ExternFuncInfo	&func = linker->exFunctions[functionID];
	char *argPos = argBuf;
	for(unsigned i = 0; i < func.paramCount; i++)
	{
		ExternLocalInfo &lInfo = linker->exLocals[func.offsetToFirstLocal + i];
		ExternTypeInfo &tInfo = linker->exTypes[lInfo.type];
		switch(tInfo.type)
		{
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_CHAR:
		case ExternTypeInfo::TYPE_SHORT:
		case ExternTypeInfo::TYPE_INT:
			*(int*)argPos = va_arg(args, int);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_LONG:
			*(long long*)argPos = va_arg(args, long long);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			*(float*)argPos = (float)va_arg(args, double);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			*(double*)argPos = va_arg(args, double);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_COMPLEX:
			static unsigned autoRefHash = GetStringHash("auto ref");
			static unsigned autoArrayHash = GetStringHash("auto[]");
#ifdef _WIN64
			if(tInfo.size <= 4)
				*(int*)argPos = va_arg(args, int);
			else if(tInfo.size <= 8)
				*(long long*)argPos = va_arg(args, long long);
			else
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			argPos += tInfo.size;
#elif defined(__aarch64__)
			if(tInfo.size <= 4)
			{
				*(int*)argPos = va_arg(args, int);
			}
			else if(tInfo.size <= 8)
			{
				*(long long*)argPos = va_arg(args, long long);
			}
			else if(tInfo.size <= 12)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else if(tInfo.size <= 16)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else
			{
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			}
			argPos += tInfo.size;
#elif defined(__x86_64__)
			if((tInfo.subCat == ExternTypeInfo::CAT_ARRAY && tInfo.arrSize == ~0u) || tInfo.subCat == ExternTypeInfo::CAT_FUNCTION)
			{
				*(NULLCArray*)argPos = va_arg(args, NULLCArray);
				argPos += 12;
			}else if(tInfo.nameHash == autoRefHash){
				*(NULLCRef*)argPos = va_arg(args, NULLCRef);
				argPos += 12;
			}else if(tInfo.nameHash == autoArrayHash){
				*(NULLCAutoArray*)argPos = va_arg(args, NULLCAutoArray);
				argPos += sizeof(NULLCAutoArray);
			}else if(tInfo.subCat == ExternTypeInfo::CAT_CLASS){
				ExternMemberInfo *memberList = &linker->exTypeExtra[tInfo.memberOffset];
				for(unsigned k = 0; k < tInfo.memberCount; k++)
				{
					const ExternTypeInfo &subType = linker->exTypes[memberList[k].type];
					switch(subType.type)
					{
					case ExternTypeInfo::TYPE_CHAR:
					case ExternTypeInfo::TYPE_SHORT:
					case ExternTypeInfo::TYPE_INT:
						*(int*)argPos = va_arg(args, int);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_LONG:
						*(long long*)argPos = va_arg(args, long long);
						argPos += 8;
						break;
					case ExternTypeInfo::TYPE_FLOAT:
						*(float*)argPos = (float)va_arg(args, double);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_DOUBLE:
						*(double*)argPos = va_arg(args, double);
						argPos += 8;
						break;
					default:
						nullcLastError = "ERROR: unsupported complex function parameter";
						return NULL;
					}
				}
			}else{
				nullcLastError = "ERROR: unsupported complex function parameter";
				return NULL;
			}
#else
			for(unsigned u = 0; u < tInfo.size >> 2; u++, argPos += 4)
				*(int*)argPos = va_arg(args, int);
#endif
			break;
		}
	}

	memcpy(argPos, &extra, sizeof(extra));
	argPos += sizeof(uintptr_t);

	return argBuf;
}